

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  LazyDict<glTF::BufferView> *this;
  LazyDict<glTF::Accessor> *this_00;
  pointer *ppfVar1;
  int iVar2;
  Buffer *pBVar3;
  void *__src;
  BufferView *pBVar4;
  iterator iVar5;
  ulong uVar6;
  void *__dest;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar7;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar8;
  runtime_error *this_01;
  ulong uVar9;
  long lVar11;
  ulong uVar12;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong uVar14;
  float *pfVar15;
  Accessor *pAVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  float fVar20;
  Ref<glTF::BufferView> RVar21;
  Ref<glTF::Accessor> RVar22;
  float float_MAX;
  float local_84;
  string local_80;
  Asset *local_60;
  string *local_58;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *local_50;
  ulong local_48;
  ulong local_40;
  Ref<glTF::Buffer> *local_38;
  uint uVar10;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar8 = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0;
    uVar9 = 0;
  }
  else {
    if ((6 < compType - ComponentType_BYTE) || ((0x6fU >> (compType & 0x1f) & 1) == 0)) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_80,"GLTF: Unsupported Component Type ","");
      std::__cxx11::string::push_back((char)&local_80);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&local_80);
      *(undefined ***)this_01 = &PTR__runtime_error_007fc4b8;
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_40 = (ulong)*(uint *)(&DAT_007fc7d8 + (ulong)typeIn * 0x10);
    iVar2 = *(int *)(&DAT_007fc7d8 + (ulong)typeOut * 0x10);
    local_48 = (ulong)*(uint *)(&DAT_006a98f0 + (ulong)(compType - ComponentType_BYTE) * 4);
    pBVar3 = (buffer->vector->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
             _M_impl.super__Vector_impl_data._M_start[buffer->index];
    uVar9 = pBVar3->byteLength;
    uVar19 = local_48 - 1 & uVar9;
    uVar14 = (ulong)(iVar2 * count *
                    *(uint *)(&DAT_006a98f0 + (ulong)(compType - ComponentType_BYTE) * 4));
    lVar11 = uVar19 + uVar14;
    local_60 = a;
    local_58 = meshName;
    local_38 = buffer;
    if (lVar11 != 0) {
      uVar12 = pBVar3->capacity;
      uVar6 = uVar9 + lVar11;
      if (uVar12 < uVar6) {
        uVar12 = (uVar12 >> 1) + uVar12;
        if (uVar12 <= uVar6) {
          uVar12 = uVar6;
        }
        pBVar3->capacity = uVar12;
        __dest = operator_new__(uVar12);
        __src = (pBVar3->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        p_Var13 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar3->mData;
        if (__src != (void *)0x0) {
          local_50 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar3->mData;
          memcpy(__dest,__src,uVar9);
          p_Var13 = local_50;
        }
        std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
        reset<unsigned_char,std::default_delete<unsigned_char[]>>(p_Var13,__dest);
        uVar6 = lVar11 + pBVar3->byteLength;
      }
      pBVar3->byteLength = uVar6;
    }
    this = &local_60->bufferViews;
    glTF::Asset::FindUniqueID(&local_80,local_60,local_58,"view");
    RVar21 = glTF::LazyDict<glTF::BufferView>::Create(this,local_80._M_dataplus._M_p);
    pvVar7 = RVar21.vector;
    uVar18 = RVar21.index;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pBVar4 = (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar18];
    (pBVar4->buffer).index = local_38->index;
    (pBVar4->buffer).vector = local_38->vector;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar18]->byteOffset = uVar19 + uVar9 & 0xffffffff;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar18]->byteLength = uVar14;
    (pvVar7->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar18]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    this_00 = &local_60->accessors;
    glTF::Asset::FindUniqueID(&local_80,local_60,local_58,"accessor");
    RVar22 = glTF::LazyDict<glTF::Accessor>::Create(this_00,local_80._M_dataplus._M_p);
    uVar10 = RVar22.index;
    pvVar8 = RVar22.vector;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    pAVar16 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar10];
    (pAVar16->bufferView).vector = pvVar7;
    (pAVar16->bufferView).index = uVar18;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10]->byteOffset = 0;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10]->byteStride = 0;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10]->componentType = compType;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10]->count = count;
    (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar10]->type = typeOut;
    uVar17 = iVar2 + (uint)(iVar2 == 0);
    local_80._M_dataplus._M_p._0_4_ = 1e+13;
    uVar18 = uVar17;
    do {
      pAVar16 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar10];
      iVar5._M_current =
           *(pointer *)
            ((long)&(pAVar16->min).super__Vector_base<float,_std::allocator<float>_>._M_impl + 8);
      if (iVar5._M_current ==
          *(pointer *)
           ((long)&(pAVar16->min).super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10))
      {
        std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                  ((vector<float,std::allocator<float>> *)&pAVar16->min,iVar5,(float *)&local_80);
      }
      else {
        *iVar5._M_current = local_80._M_dataplus._M_p._0_4_;
        ppfVar1 = (pointer *)
                  ((long)&(pAVar16->min).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  8);
        *ppfVar1 = *ppfVar1 + 1;
      }
      local_84 = -local_80._M_dataplus._M_p._0_4_;
      pAVar16 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar10];
      iVar5._M_current =
           *(pointer *)
            ((long)&(pAVar16->max).super__Vector_base<float,_std::allocator<float>_>._M_impl + 8);
      if (iVar5._M_current ==
          *(pointer *)
           ((long)&(pAVar16->max).super__Vector_base<float,_std::allocator<float>_>._M_impl + 0x10))
      {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&pAVar16->max,iVar5,&local_84);
      }
      else {
        *iVar5._M_current = local_84;
        ppfVar1 = (pointer *)
                  ((long)&(pAVar16->max).super__Vector_base<float,_std::allocator<float>_>._M_impl +
                  8);
        *ppfVar1 = *ppfVar1 + 1;
      }
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
    uVar9 = 0;
    do {
      uVar14 = 0;
      do {
        if (typeOut == SCALAR) {
          fVar20 = (float)*(ushort *)((long)data + uVar9 * 2);
        }
        else {
          pfVar15 = (float *)((long)data + uVar9 * 0xc + 8);
          if (((int)uVar14 != 2) &&
             (pfVar15 = (float *)((long)data + uVar9 * 0xc), (int)uVar14 == 1)) {
            pfVar15 = (float *)((long)data + uVar9 * 0xc + 4);
          }
          fVar20 = *pfVar15;
        }
        pAVar16 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar10];
        lVar11 = *(long *)&(pAVar16->min).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data;
        if (fVar20 < *(float *)(lVar11 + uVar14 * 4)) {
          *(float *)(lVar11 + uVar14 * 4) = fVar20;
          pAVar16 = (pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>
                    )._M_impl.super__Vector_impl_data._M_start[uVar10];
        }
        lVar11 = *(long *)&(pAVar16->max).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data;
        pfVar15 = (float *)(lVar11 + uVar14 * 4);
        if (*pfVar15 <= fVar20 && fVar20 != *pfVar15) {
          *(float *)(lVar11 + uVar14 * 4) = fVar20;
        }
        uVar14 = uVar14 + 1;
      } while (uVar17 != uVar14);
      uVar9 = uVar9 + 1;
    } while (uVar9 != count);
    glTF::Accessor::WriteData
              ((pvVar8->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar10],(ulong)count,data,
               (ulong)(uint)((int)local_40 * (int)local_48));
    uVar9 = (ulong)uVar10;
  }
  RVar22._8_8_ = uVar9;
  RVar22.vector = pvVar8;
  return RVar22;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
    {
        // Allocate and initialize with large values.
        float float_MAX = 10000000000000.0f;
        for (unsigned int i = 0 ; i < numCompsOut ; i++) {
            acc->min.push_back( float_MAX);
            acc->max.push_back(-float_MAX);
        }

        // Search and set extreme values.
        float valueTmp;
        for (unsigned int i = 0 ; i < count       ; i++) {
            for (unsigned int j = 0 ; j < numCompsOut ; j++) {
                if (numCompsOut == 1) {
                  valueTmp = static_cast<unsigned short*>(data)[i];
                } else {
                  valueTmp = static_cast<aiVector3D*>(data)[i][j];
                }

                if (valueTmp < acc->min[j]) {
                    acc->min[j] = valueTmp;
                }
                if (valueTmp > acc->max[j]) {
                    acc->max[j] = valueTmp;
                }
            }
        }
    }

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}